

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

ValueInfo * __thiscall
GlobOpt::UpdateIntBoundsForLessThanOrEqual
          (GlobOpt *this,Value *value,IntConstantBounds *constantBounds,Value *boundValue,
          IntConstantBounds *boundConstantBounds,int boundOffset,bool isExplicit)

{
  int iVar1;
  code *pcVar2;
  Value *constantBounds_00;
  bool bVar3;
  ValueNumber VVar4;
  ValueNumber VVar5;
  int32 iVar6;
  int32 iVar7;
  undefined4 *puVar8;
  IntBounds *pIVar9;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar10;
  IntBoundedValueInfo *pIVar11;
  int *piVar12;
  GlobOpt *local_a8;
  int32 local_60;
  int local_5c;
  int32 local_58;
  int32 newMax;
  int32 adjustedBoundMax;
  IntBounds *bounds;
  ValueInfo *valueInfo;
  bool isExplicit_local;
  IntConstantBounds *pIStack_38;
  int boundOffset_local;
  IntConstantBounds *boundConstantBounds_local;
  Value *boundValue_local;
  IntConstantBounds *constantBounds_local;
  Value *value_local;
  GlobOpt *this_local;
  
  valueInfo._3_1_ = isExplicit;
  valueInfo._4_4_ = boundOffset;
  pIStack_38 = boundConstantBounds;
  boundConstantBounds_local = (IntConstantBounds *)boundValue;
  boundValue_local = (Value *)constantBounds;
  constantBounds_local = (IntConstantBounds *)value;
  value_local = (Value *)this;
  if ((value == (Value *)0x0) && (bVar3 = IntConstantBounds::IsConstant(constantBounds), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x27d,"(value || constantBounds.IsConstant())",
                       "value || constantBounds.IsConstant()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if ((boundConstantBounds_local == (IntConstantBounds *)0x0) &&
     (bVar3 = IntConstantBounds::IsConstant(pIStack_38), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x27e,"(boundValue || boundConstantBounds.IsConstant())",
                       "boundValue || boundConstantBounds.IsConstant()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (constantBounds_local == (IntConstantBounds *)0x0) {
    this_local = (GlobOpt *)0x0;
  }
  else {
    if (boundConstantBounds_local != (IntConstantBounds *)0x0) {
      VVar4 = ::Value::GetValueNumber((Value *)constantBounds_local);
      VVar5 = ::Value::GetValueNumber((Value *)boundConstantBounds_local);
      if (VVar4 == VVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x283,
                           "(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber())"
                           ,"!boundValue || value->GetValueNumber() != boundValue->GetValueNumber()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    pIVar9 = (IntBounds *)::Value::GetValueInfo((Value *)constantBounds_local);
    constantBounds_00 = boundValue_local;
    bounds = pIVar9;
    bVar3 = IntConstantBounds::IsConstant(pIStack_38);
    pIVar9 = GetIntBoundsToUpdate
                       (this,(ValueInfo *)pIVar9,(IntConstantBounds *)constantBounds_00,true,bVar3,
                        true,(bool)(valueInfo._3_1_ & 1));
    _adjustedBoundMax = pIVar9;
    if (pIVar9 != (IntBounds *)0x0) {
      if (boundConstantBounds_local == (IntConstantBounds *)0x0) {
        iVar7 = IntConstantBounds::LowerBound(pIStack_38);
        IntBounds::SetUpperBound(pIVar9,iVar7,valueInfo._4_4_,(bool)(valueInfo._3_1_ & 1));
      }
      else {
        VVar4 = ::Value::GetValueNumber((Value *)constantBounds_local);
        IntBounds::SetUpperBound
                  (pIVar9,VVar4,(Value *)boundConstantBounds_local,valueInfo._4_4_,
                   (bool)(valueInfo._3_1_ & 1));
      }
      pIVar9 = _adjustedBoundMax;
      paVar10 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                ValueInfo::Type((ValueInfo *)bounds);
      newMax._2_2_ = *paVar10;
      bVar3 = IntBounds::RequiresIntBoundedValueInfo(pIVar9,(ValueType)newMax._2_2_);
      if (bVar3) {
        pIVar11 = NewIntBoundedValueInfo(this,(ValueInfo *)bounds,_adjustedBoundMax);
        return &pIVar11->super_ValueInfo;
      }
      IntBounds::Delete(_adjustedBoundMax);
    }
    bVar3 = ValueType::IsInt((ValueType *)&bounds->wasConstantUpperBoundEstablishedExplicitly);
    if (bVar3) {
      if (valueInfo._4_4_ == 0) {
        local_58 = IntConstantBounds::UpperBound(pIStack_38);
      }
      else if (valueInfo._4_4_ == -1) {
        iVar7 = IntConstantBounds::UpperBound(pIStack_38);
        iVar6 = IntConstantBounds::UpperBound(pIStack_38);
        if (iVar6 <= iVar7 + -1) {
          return (ValueInfo *)0x0;
        }
        local_58 = IntConstantBounds::UpperBound(pIStack_38);
        local_58 = local_58 + -1;
      }
      else {
        iVar7 = IntConstantBounds::UpperBound(pIStack_38);
        bVar3 = Int32Math::Add(iVar7,valueInfo._4_4_,&local_58);
        if (bVar3) {
          return (ValueInfo *)0x0;
        }
      }
      local_60 = IntConstantBounds::UpperBound((IntConstantBounds *)boundValue_local);
      piVar12 = min<int>(&local_60,&local_58);
      iVar1 = *piVar12;
      local_5c = iVar1;
      iVar7 = IntConstantBounds::LowerBound((IntConstantBounds *)boundValue_local);
      pIVar9 = bounds;
      if (iVar1 < iVar7) {
        local_a8 = (GlobOpt *)0x0;
      }
      else {
        iVar7 = IntConstantBounds::LowerBound((IntConstantBounds *)boundValue_local);
        local_a8 = (GlobOpt *)NewIntRangeValueInfo(this,(ValueInfo *)pIVar9,iVar7,local_5c);
      }
      this_local = local_a8;
    }
    else {
      this_local = (GlobOpt *)0x0;
    }
  }
  return (ValueInfo *)this_local;
}

Assistant:

ValueInfo *GlobOpt::UpdateIntBoundsForLessThanOrEqual(
    Value *const value,
    const IntConstantBounds &constantBounds,
    Value *const boundValue,
    const IntConstantBounds &boundConstantBounds,
    const int boundOffset,
    const bool isExplicit)
{
    Assert(value || constantBounds.IsConstant());
    Assert(boundValue || boundConstantBounds.IsConstant());
    if(!value)
    {
        return nullptr;
    }
    Assert(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber());

    ValueInfo *const valueInfo = value->GetValueInfo();
    IntBounds *const bounds =
        GetIntBoundsToUpdate(valueInfo, constantBounds, true, boundConstantBounds.IsConstant(), true, isExplicit);
    if(bounds)
    {
        if(boundValue)
        {
            bounds->SetUpperBound(value->GetValueNumber(), boundValue, boundOffset, isExplicit);
        }
        else
        {
            bounds->SetUpperBound(boundConstantBounds.LowerBound(), boundOffset, isExplicit);
        }
        if(bounds->RequiresIntBoundedValueInfo(valueInfo->Type()))
        {
            return NewIntBoundedValueInfo(valueInfo, bounds);
        }
        bounds->Delete();
    }

    if(!valueInfo->IsInt())
    {
        return nullptr;
    }

    int32 adjustedBoundMax;
    if(boundOffset == 0)
    {
        adjustedBoundMax = boundConstantBounds.UpperBound();
    }
    else if(boundOffset == -1)
    {
        if(boundConstantBounds.UpperBound() - 1 >= boundConstantBounds.UpperBound())
        {
            return nullptr;
        }
        adjustedBoundMax = boundConstantBounds.UpperBound() - 1;
    }
    else if(Int32Math::Add(boundConstantBounds.UpperBound(), boundOffset, &adjustedBoundMax))
    {
        return nullptr;
    }
    const int32 newMax = min(constantBounds.UpperBound(), adjustedBoundMax);
    return
        newMax >= constantBounds.LowerBound()
            ? NewIntRangeValueInfo(valueInfo, constantBounds.LowerBound(), newMax)
            : nullptr;
}